

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 c;
  bool bVar4;
  byte bVar5;
  short sVar6;
  byte bVar7;
  stbi_uc sVar8;
  int iVar9;
  stbi__uint32 sVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  stbi__jpeg *z;
  byte *pbVar15;
  byte *pbVar16;
  void *pvVar17;
  code *pcVar18;
  stbi_uc *psVar19;
  stbi_uc *psVar20;
  long lVar21;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int iVar22;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint extraout_EDX_08;
  uint uVar23;
  undefined8 extraout_RDX;
  undefined8 uVar24;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *paVar25;
  ulong extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  short *psVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  int *piVar33;
  char *pcVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  stbi__context *psVar38;
  int *piVar39;
  long *in_FS_OFFSET;
  bool bVar40;
  stbi_uc *coutput [4];
  short data [64];
  short local_18c;
  int local_17c;
  stbi_uc *local_148 [3];
  long lStack_130;
  long local_128;
  anon_struct_96_18_0d0905d3 *local_120;
  stbi__jpeg *local_118;
  stbi__uint32 *local_110;
  stbi__uint32 *local_108;
  int *local_100;
  short local_f8 [4];
  undefined8 local_f0 [2];
  int local_e0 [44];
  
  z = (stbi__jpeg *)calloc(1,0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
    return (void *)0x0;
  }
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  local_110 = (stbi__uint32 *)x;
  local_108 = (stbi__uint32 *)y;
  local_100 = comp;
  iVar9 = stbi__decode_jpeg_header(z,0);
  uVar23 = extraout_EDX;
  if (iVar9 == 0) {
LAB_0043fe1b:
    uVar28 = z->s->img_n;
LAB_0043fe25:
    stbi__free_jpeg_components(z,uVar28,uVar23);
  }
  else {
    paVar1 = z->img_comp;
    bVar7 = stbi__get_marker(z);
    uVar24 = extraout_RDX;
LAB_0043e132:
    uVar23 = (uint)uVar24;
    pcVar34 = "bad SOS component count";
    if (bVar7 == 0xda) {
      iVar9 = stbi__get16be(z->s);
      psVar38 = z->s;
      pbVar16 = psVar38->img_buffer;
      paVar25 = extraout_RDX_02;
      if (pbVar16 < psVar38->img_buffer_end) {
        psVar38->img_buffer = pbVar16 + 1;
        bVar7 = *pbVar16;
      }
      else {
        if (psVar38->read_from_callbacks == 0) {
          z->scan_n = 0;
          goto LAB_0043fe08;
        }
        psVar19 = psVar38->buffer_start;
        iVar13 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
        psVar38->callback_already_read =
             psVar38->callback_already_read +
             (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
        if (iVar13 == 0) {
          psVar38->read_from_callbacks = 0;
          psVar20 = psVar38->buffer_start + 1;
          psVar38->buffer_start[0] = '\0';
          bVar7 = 0;
        }
        else {
          psVar20 = psVar19 + iVar13;
          bVar7 = *psVar19;
        }
        psVar38->img_buffer_end = psVar20;
        psVar38->img_buffer = psVar38->buffer_start + 1;
        paVar25 = extraout_RDX_03;
      }
      uVar23 = (uint)bVar7;
      z->scan_n = uVar23;
      if ((0xfb < (byte)(bVar7 - 5)) && (psVar38 = z->s, (int)uVar23 <= psVar38->img_n)) {
        if (iVar9 != uVar23 * 2 + 6) {
          pcVar34 = "bad SOS len";
          goto LAB_0043fe08;
        }
        lVar36 = 0;
        do {
          pbVar15 = psVar38->img_buffer;
          pbVar16 = psVar38->img_buffer_end;
          if (pbVar15 < pbVar16) {
            psVar38->img_buffer = pbVar15 + 1;
            uVar28 = (uint)*pbVar15;
            pbVar15 = pbVar15 + 1;
          }
          else if (psVar38->read_from_callbacks == 0) {
            uVar28 = 0;
          }
          else {
            psVar19 = psVar38->buffer_start;
            iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
            psVar38->callback_already_read =
                 psVar38->callback_already_read +
                 (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
            if (iVar9 == 0) {
              psVar38->read_from_callbacks = 0;
              psVar20 = psVar38->buffer_start + 1;
              psVar38->buffer_start[0] = '\0';
              uVar28 = 0;
            }
            else {
              psVar20 = psVar19 + iVar9;
              uVar28 = (uint)*psVar19;
            }
            psVar38->img_buffer_end = psVar20;
            psVar38->img_buffer = psVar38->buffer_start + 1;
            psVar38 = z->s;
            pbVar15 = psVar38->img_buffer;
            pbVar16 = psVar38->img_buffer_end;
          }
          if (pbVar15 < pbVar16) {
            psVar38->img_buffer = pbVar15 + 1;
            uVar35 = (uint)*pbVar15;
          }
          else if (psVar38->read_from_callbacks == 0) {
            uVar35 = 0;
          }
          else {
            psVar19 = psVar38->buffer_start;
            iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
            psVar38->callback_already_read =
                 psVar38->callback_already_read +
                 (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
            if (iVar9 == 0) {
              psVar38->read_from_callbacks = 0;
              psVar20 = psVar38->buffer_start + 1;
              psVar38->buffer_start[0] = '\0';
              uVar35 = 0;
            }
            else {
              psVar20 = psVar19 + iVar9;
              uVar35 = (uint)*psVar19;
            }
            psVar38->img_buffer_end = psVar20;
            psVar38->img_buffer = psVar38->buffer_start + 1;
            psVar38 = z->s;
          }
          uVar23 = psVar38->img_n;
          if ((long)(int)uVar23 < 1) {
            uVar26 = 0;
          }
          else {
            uVar26 = 0;
            paVar25 = paVar1;
            while (paVar25->id != uVar28) {
              uVar26 = uVar26 + 1;
              paVar25 = paVar25 + 1;
              if ((long)(int)uVar23 == uVar26) goto LAB_0043fe1b;
            }
          }
          if ((uint)uVar26 == uVar23) goto LAB_0043fe1b;
          uVar32 = uVar26 & 0xffffffff;
          paVar25 = (anon_struct_96_18_0d0905d3 *)(uVar32 * 0x60);
          z->img_comp[uVar32].hd = uVar35 >> 4;
          if (0x3f < (byte)uVar35) {
            pcVar34 = "bad DC huff";
            goto LAB_0043fe08;
          }
          paVar25 = paVar1 + uVar32;
          paVar25->ha = uVar35 & 0xf;
          if (3 < (uVar35 & 0xf)) {
            pcVar34 = "bad AC huff";
            goto LAB_0043fe08;
          }
          z->order[lVar36] = (uint)uVar26;
          lVar36 = lVar36 + 1;
        } while (lVar36 < z->scan_n);
        pbVar16 = psVar38->img_buffer;
        pbVar15 = psVar38->img_buffer_end;
        if (pbVar16 < pbVar15) {
          psVar38->img_buffer = pbVar16 + 1;
          bVar7 = *pbVar16;
          pbVar16 = pbVar16 + 1;
        }
        else if (psVar38->read_from_callbacks == 0) {
          bVar7 = 0;
        }
        else {
          psVar19 = psVar38->buffer_start;
          iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
          psVar38->callback_already_read =
               psVar38->callback_already_read +
               (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
          if (iVar9 == 0) {
            psVar38->read_from_callbacks = 0;
            psVar20 = psVar38->buffer_start + 1;
            psVar38->buffer_start[0] = '\0';
            bVar7 = 0;
          }
          else {
            psVar20 = psVar19 + iVar9;
            bVar7 = *psVar19;
          }
          psVar38->img_buffer_end = psVar20;
          psVar38->img_buffer = psVar38->buffer_start + 1;
          psVar38 = z->s;
          pbVar16 = psVar38->img_buffer;
          pbVar15 = psVar38->img_buffer_end;
        }
        z->spec_start = (uint)bVar7;
        if (pbVar16 < pbVar15) {
          psVar38->img_buffer = pbVar16 + 1;
          uVar23 = (uint)*pbVar16;
          pbVar16 = pbVar16 + 1;
        }
        else if (psVar38->read_from_callbacks == 0) {
          uVar23 = 0;
        }
        else {
          psVar19 = psVar38->buffer_start;
          iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
          psVar38->callback_already_read =
               psVar38->callback_already_read +
               (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
          if (iVar9 == 0) {
            psVar38->read_from_callbacks = 0;
            psVar20 = psVar38->buffer_start + 1;
            psVar38->buffer_start[0] = '\0';
            uVar23 = 0;
          }
          else {
            psVar20 = psVar19 + iVar9;
            uVar23 = (uint)*psVar19;
          }
          psVar38->img_buffer_end = psVar20;
          psVar38->img_buffer = psVar38->buffer_start + 1;
          psVar38 = z->s;
          pbVar16 = psVar38->img_buffer;
          pbVar15 = psVar38->img_buffer_end;
        }
        z->spec_end = uVar23;
        if (pbVar16 < pbVar15) {
          psVar38->img_buffer = pbVar16 + 1;
          uVar23 = (uint)*pbVar16;
        }
        else if (psVar38->read_from_callbacks == 0) {
          uVar23 = 0;
        }
        else {
          psVar19 = psVar38->buffer_start;
          iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
          psVar38->callback_already_read =
               psVar38->callback_already_read +
               (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
          if (iVar9 == 0) {
            psVar38->read_from_callbacks = 0;
            psVar20 = psVar38->buffer_start + 1;
            psVar38->buffer_start[0] = '\0';
            uVar23 = 0;
          }
          else {
            psVar20 = psVar19 + iVar9;
            uVar23 = (uint)*psVar19;
          }
          psVar38->img_buffer_end = psVar20;
          psVar38->img_buffer = psVar38->buffer_start + 1;
        }
        z->succ_high = uVar23 >> 4;
        uVar28 = uVar23 & 0xf;
        paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
        z->succ_low = uVar28;
        iVar9 = z->progressive;
        iVar13 = z->spec_start;
        pcVar34 = "bad SOS";
        if (iVar9 != 0) {
          if ((((iVar13 < 0x40) && (z->spec_end < 0x40)) && (iVar13 <= z->spec_end)) &&
             (((byte)uVar23 < 0xe0 && (uVar28 < 0xe)))) goto LAB_0043e64a;
          goto LAB_0043fe08;
        }
        if ((iVar13 != 0) || ((0xf < (byte)uVar23 || (uVar28 != 0)))) goto LAB_0043fe08;
        z->spec_end = 0x3f;
LAB_0043e64a:
        uVar23 = z->scan_n;
        uVar26 = (ulong)uVar23;
        iVar13 = z->restart_interval;
        if (iVar13 == 0) {
          iVar13 = 0x7fffffff;
        }
        z->code_buffer = 0;
        z->code_bits = 0;
        z->nomore = 0;
        z->img_comp[3].dc_pred = 0;
        z->img_comp[2].dc_pred = 0;
        z->img_comp[1].dc_pred = 0;
        z->img_comp[0].dc_pred = 0;
        z->marker = 0xff;
        z->todo = iVar13;
        z->eob_run = 0;
        if (iVar9 == 0) {
          if (uVar23 == 1) {
            iVar9 = z->order[0];
            iVar13 = z->img_comp[iVar9].y + 7 >> 3;
            bVar40 = true;
            uVar23 = 1;
            if (0 < iVar13) {
              uVar28 = paVar1[iVar9].x + 7 >> 3;
              iVar14 = 0;
              iVar22 = 0;
              do {
                if (0 < (int)uVar28) {
                  lVar36 = 0;
                  do {
                    iVar11 = stbi__jpeg_decode_block
                                       (z,local_f8,z->huff_dc + paVar1[iVar9].hd,
                                        z->huff_ac + paVar1[iVar9].ha,z->fast_ac[paVar1[iVar9].ha],
                                        iVar9,z->dequant[paVar1[iVar9].tq]);
                    uVar23 = extraout_EDX_02;
                    if (iVar11 == 0) goto LAB_0043f531;
                    (*z->idct_block_kernel)
                              (paVar1[iVar9].data + lVar36 + iVar14 * paVar1[iVar9].w2,
                               paVar1[iVar9].w2,local_f8);
                    uVar23 = (uint)extraout_RDX_04;
                    iVar11 = z->todo;
                    z->todo = iVar11 + -1;
                    uVar26 = extraout_RDX_04;
                    if (iVar11 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar23 = extraout_EDX_03;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_0043f11d;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar11 = z->restart_interval;
                      uVar26 = 0x7fffffff;
                      if (iVar11 == 0) {
                        iVar11 = 0x7fffffff;
                      }
                      z->todo = iVar11;
                      z->eob_run = 0;
                    }
                    lVar36 = lVar36 + 8;
                  } while ((ulong)uVar28 * 8 != lVar36);
                }
                uVar23 = (uint)uVar26;
                iVar22 = iVar22 + 1;
                iVar14 = iVar14 + 8;
              } while (iVar22 != iVar13);
LAB_0043f11d:
              bVar40 = true;
            }
          }
          else {
            uVar23 = z->img_mcu_y;
            uVar26 = (ulong)uVar23;
            bVar40 = true;
            if (0 < (int)uVar23) {
              iVar9 = z->img_mcu_x;
              iVar22 = 0;
              do {
                if (0 < iVar9) {
                  uVar28 = 0;
                  do {
                    iVar9 = z->scan_n;
                    if (0 < iVar9) {
                      uVar26 = 0;
                      do {
                        iVar13 = z->order[uVar26];
                        iVar14 = z->img_comp[iVar13].v;
                        if (0 < iVar14) {
                          iVar9 = paVar1[iVar13].h;
                          iVar11 = 0;
                          do {
                            if (0 < iVar9) {
                              iVar14 = 0;
                              do {
                                iVar27 = paVar1[iVar13].v;
                                iVar12 = stbi__jpeg_decode_block
                                                   (z,local_f8,z->huff_dc + paVar1[iVar13].hd,
                                                    z->huff_ac + paVar1[iVar13].ha,
                                                    z->fast_ac[paVar1[iVar13].ha],iVar13,
                                                    z->dequant[paVar1[iVar13].tq]);
                                uVar23 = extraout_EDX_05;
                                if (iVar12 == 0) goto LAB_0043f531;
                                (*z->idct_block_kernel)
                                          (paVar1[iVar13].data +
                                           (long)(int)((iVar9 * uVar28 + iVar14) * 8) +
                                           (long)((iVar27 * iVar22 + iVar11) * paVar1[iVar13].w2 * 8
                                                 ),paVar1[iVar13].w2,local_f8);
                                iVar14 = iVar14 + 1;
                                iVar9 = paVar1[iVar13].h;
                              } while (iVar14 < iVar9);
                              iVar14 = paVar1[iVar13].v;
                            }
                            iVar11 = iVar11 + 1;
                          } while (iVar11 < iVar14);
                          iVar9 = z->scan_n;
                        }
                        uVar26 = uVar26 + 1;
                      } while ((long)uVar26 < (long)iVar9);
                      iVar13 = z->todo;
                    }
                    uVar23 = (uint)uVar26;
                    bVar40 = true;
                    z->todo = iVar13 + -1;
                    bVar4 = iVar13 < 2;
                    iVar13 = iVar13 + -1;
                    if (bVar4) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar23 = extraout_EDX_06;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_0043f534;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar13 = z->restart_interval;
                      if (iVar13 == 0) {
                        iVar13 = 0x7fffffff;
                      }
                      z->todo = iVar13;
                      z->eob_run = 0;
                    }
                    uVar28 = uVar28 + 1;
                    uVar26 = (ulong)uVar28;
                    iVar9 = z->img_mcu_x;
                  } while ((int)uVar28 < iVar9);
                  uVar26 = (ulong)(uint)z->img_mcu_y;
                }
                bVar40 = true;
                iVar22 = iVar22 + 1;
                uVar23 = (uint)uVar26;
              } while (iVar22 < (int)uVar23);
            }
          }
          goto LAB_0043f534;
        }
        if (uVar23 == 1) {
          local_128 = (long)z->order[0];
          iVar9 = z->img_comp[local_128].y + 7 >> 3;
          if (0 < iVar9) {
            local_120 = paVar1 + local_128;
            iVar13 = z->img_comp[local_128].x + 7 >> 3;
            local_17c = 0;
            do {
              if (0 < iVar13) {
                iVar22 = 0;
                do {
                  psVar29 = local_120->coeff + (local_120->coeff_w * local_17c + iVar22) * 0x40;
                  uVar26 = (ulong)z->spec_start;
                  if (uVar26 == 0) {
                    iVar14 = stbi__jpeg_decode_block_prog_dc
                                       (z,psVar29,z->huff_dc + local_120->hd,(int)local_128);
                    uVar23 = extraout_EDX_01;
                    if (iVar14 == 0) goto LAB_0043fe1b;
                  }
                  else {
                    iVar14 = local_120->ha;
                    iVar11 = z->eob_run;
                    bVar7 = (byte)z->succ_low;
                    if (z->succ_high == 0) {
                      if (iVar11 == 0) {
                        paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)z->code_bits;
                        do {
                          if ((int)paVar25 < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          uVar23 = z->code_buffer;
                          uVar32 = (ulong)(uVar23 >> 0x17);
                          sVar3 = z->fast_ac[iVar14][uVar32];
                          uVar28 = (uint)sVar3;
                          iVar11 = (int)uVar26;
                          if (sVar3 == 0) {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                              uVar23 = z->code_buffer;
                              uVar32 = (ulong)(uVar23 >> 0x17);
                            }
                            uVar26 = (ulong)z->huff_ac[iVar14].fast[uVar32];
                            if (uVar26 == 0xff) {
                              lVar36 = 0;
                              do {
                                lVar21 = lVar36;
                                lVar36 = lVar21 + 1;
                              } while (z->huff_ac[iVar14].maxcode[lVar21 + 10] <= uVar23 >> 0x10);
                              uVar28 = z->code_bits;
                              paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                              if (lVar36 == 8) goto LAB_0043fdf6;
                              if (((int)uVar28 < (int)(lVar21 + 10)) ||
                                 (uVar35 = (uVar23 >> (0x17U - (char)lVar36 & 0x1f) &
                                           stbi__bmask[lVar21 + 10]) +
                                           z->huff_ac[iVar14].delta[lVar21 + 10], 0xff < uVar35))
                              goto LAB_0043fe01;
                              uVar26 = (ulong)uVar35;
                              bVar2 = z->huff_ac[iVar14].size[uVar26];
                              if ((uVar23 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                  (uint)z->huff_ac[iVar14].code[uVar26]) goto LAB_0043fe4a;
                              uVar28 = (uVar28 - (int)lVar36) - 9;
                              paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                              z->code_bits = uVar28;
                              z->code_buffer = uVar23 << ((byte)(lVar21 + 10) & 0x1f);
                            }
                            else {
                              bVar2 = z->huff_ac[iVar14].size[uVar26];
                              uVar28 = z->code_bits - (uint)bVar2;
                              paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                              if (z->code_bits < (int)(uint)bVar2) goto LAB_0043fe01;
                              z->code_buffer = uVar23 << (bVar2 & 0x1f);
                              z->code_bits = uVar28;
                            }
                            bVar2 = z->huff_ac[iVar14].values[uVar26];
                            uVar28 = bVar2 & 0xf;
                            bVar5 = bVar2 >> 4;
                            uVar23 = (uint)bVar5;
                            iVar27 = (int)paVar25;
                            if ((bVar2 & 0xf) == 0) {
                              if (bVar2 < 0xf0) {
                                iVar11 = 1 << bVar5;
                                z->eob_run = iVar11;
                                if (0xf < bVar2) {
                                  if (iVar27 < (int)uVar23) {
                                    stbi__grow_buffer_unsafe(z);
                                    iVar27 = z->code_bits;
                                  }
                                  uVar28 = 0;
                                  if ((int)uVar23 <= iVar27) {
                                    uVar28 = z->code_buffer << bVar5 |
                                             z->code_buffer >> 0x20 - bVar5;
                                    uVar35 = stbi__bmask[uVar23];
                                    z->code_buffer = ~uVar35 & uVar28;
                                    uVar28 = uVar28 & uVar35;
                                    z->code_bits = iVar27 - uVar23;
                                  }
                                  iVar11 = uVar28 + z->eob_run;
                                }
                                goto LAB_0043e88c;
                              }
                              uVar26 = (ulong)(iVar11 + 0x10);
                            }
                            else {
                              lVar36 = (long)iVar11 + (ulong)uVar23;
                              bVar2 = ""[lVar36];
                              if (iVar27 < (int)uVar28) {
                                stbi__grow_buffer_unsafe(z);
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)z->code_bits;
                              }
                              iVar11 = 0;
                              uVar23 = (int)paVar25 - uVar28;
                              if ((int)uVar28 <= (int)paVar25) {
                                uVar35 = z->code_buffer;
                                uVar31 = uVar35 << (sbyte)uVar28 | uVar35 >> 0x20 - (sbyte)uVar28;
                                uVar37 = *(uint *)((long)stbi__bmask + (ulong)(uVar28 * 4));
                                z->code_buffer = ~uVar37 & uVar31;
                                z->code_bits = uVar23;
                                iVar11 = 0;
                                if (-1 < (int)uVar35) {
                                  iVar11 = *(int *)((long)stbi__jbias + (ulong)(uVar28 * 4));
                                }
                                iVar11 = (uVar31 & uVar37) + iVar11;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar23;
                              }
                              uVar26 = (ulong)((int)lVar36 + 1);
                              psVar29[bVar2] = (short)(iVar11 << (bVar7 & 0x1f));
                            }
                          }
                          else {
                            uVar35 = uVar28 & 0xf;
                            uVar37 = z->code_bits - uVar35;
                            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar37;
                            if (z->code_bits < (int)uVar35) goto LAB_0043fe01;
                            lVar36 = (long)iVar11 + (ulong)(uVar28 >> 4 & 0xf);
                            z->code_buffer = uVar23 << (sbyte)uVar35;
                            z->code_bits = uVar37;
                            uVar26 = (ulong)((int)lVar36 + 1);
                            psVar29[""[lVar36]] = (short)((uVar28 >> 8) << (bVar7 & 0x1f));
                          }
                        } while ((int)uVar26 <= z->spec_end);
                      }
                      else {
LAB_0043e88c:
                        z->eob_run = iVar11 + -1;
                      }
                    }
                    else if (iVar11 == 0) {
                      iVar11 = 0x10000 << (bVar7 & 0x1f);
                      uVar23 = iVar11 >> 0x10;
                      paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)z->code_bits;
                      do {
                        if ((int)paVar25 < 0x10) {
                          stbi__grow_buffer_unsafe(z);
                        }
                        uVar35 = z->code_buffer;
                        uVar32 = (ulong)z->huff_ac[iVar14].fast[uVar35 >> 0x17];
                        if (uVar32 == 0xff) {
                          lVar36 = 0;
                          do {
                            lVar21 = lVar36;
                            lVar36 = lVar21 + 1;
                          } while (z->huff_ac[iVar14].maxcode[lVar21 + 10] <= uVar35 >> 0x10);
                          uVar28 = z->code_bits;
                          paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                          if (lVar36 == 8) goto LAB_0043fdf6;
                          if (((int)uVar28 < (int)(lVar21 + 10)) ||
                             (uVar37 = (uVar35 >> (0x17U - (char)lVar36 & 0x1f) &
                                       stbi__bmask[lVar21 + 10]) +
                                       z->huff_ac[iVar14].delta[lVar21 + 10], 0xff < uVar37))
                          goto LAB_0043fe01;
                          uVar32 = (ulong)uVar37;
                          bVar7 = z->huff_ac[iVar14].size[uVar32];
                          if ((uVar35 >> (-bVar7 & 0x1f) & stbi__bmask[bVar7]) !=
                              (uint)z->huff_ac[iVar14].code[uVar32]) {
LAB_0043fe4a:
                            __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                                          ,0x85c,
                                          "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                         );
                          }
                          uVar28 = (uVar28 - (int)lVar36) - 9;
                          paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                          z->code_bits = uVar28;
                          sVar10 = uVar35 << ((byte)(lVar21 + 10) & 0x1f);
                          z->code_buffer = sVar10;
                        }
                        else {
                          bVar7 = z->huff_ac[iVar14].size[uVar32];
                          uVar28 = z->code_bits - (uint)bVar7;
                          paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                          if (z->code_bits < (int)(uint)bVar7) goto LAB_0043fe01;
                          sVar10 = uVar35 << (bVar7 & 0x1f);
                          z->code_buffer = sVar10;
                          z->code_bits = uVar28;
                        }
                        bVar7 = z->huff_ac[iVar14].values[uVar32];
                        bVar2 = bVar7 >> 4;
                        uVar35 = (uint)bVar2;
                        uVar28 = (uint)paVar25;
                        if ((bVar7 & 0xf) == 1) {
                          uVar37 = uVar35;
                          if ((int)uVar28 < 1) {
                            stbi__grow_buffer_unsafe(z);
                            uVar28 = z->code_bits;
                            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                            local_18c = (short)-uVar23;
                            if ((int)uVar28 < 1) goto LAB_0043eb7e;
                            sVar10 = z->code_buffer;
                          }
                          z->code_buffer = sVar10 * 2;
                          paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar28 - 1);
                          z->code_bits = uVar28 - 1;
                          uVar28 = -uVar23;
                          if ((int)sVar10 < 0) {
                            uVar28 = uVar23;
                          }
                          local_18c = (short)uVar28;
                        }
                        else {
                          if ((bVar7 & 0xf) != 0) goto LAB_0043fe01;
                          local_18c = 0;
                          uVar37 = 0xf;
                          if (bVar7 < 0xf0) {
                            z->eob_run = ~(-1 << bVar2);
                            uVar37 = 0x40;
                            if (0xf < bVar7) {
                              if ((int)uVar28 < (int)uVar35) {
                                stbi__grow_buffer_unsafe(z);
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)z->code_bits;
                              }
                              local_18c = 0;
                              uVar31 = 0;
                              uVar28 = (int)paVar25 - uVar35;
                              if ((int)uVar35 <= (int)paVar25) {
                                uVar31 = z->code_buffer << bVar2 | z->code_buffer >> 0x20 - bVar2;
                                uVar35 = stbi__bmask[uVar35];
                                z->code_buffer = ~uVar35 & uVar31;
                                uVar31 = uVar31 & uVar35;
                                z->code_bits = uVar28;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar28;
                              }
                              z->eob_run = z->eob_run + uVar31;
                            }
                          }
                        }
LAB_0043eb7e:
                        uVar28 = z->spec_end;
                        uVar32 = (ulong)uVar28;
                        if ((int)uVar26 <= (int)uVar28) {
                          uVar30 = (long)(int)uVar26;
                          do {
                            uVar28 = (uint)uVar32;
                            uVar35 = (uint)paVar25;
                            bVar7 = ""[uVar30];
                            if (psVar29[bVar7] == 0) {
                              if (uVar37 == 0) {
                                uVar26 = (ulong)((int)uVar30 + 1);
                                psVar29[bVar7] = local_18c;
                                break;
                              }
                              uVar37 = uVar37 - 1;
                            }
                            else {
                              if ((int)uVar35 < 1) {
                                stbi__grow_buffer_unsafe(z);
                                uVar35 = z->code_bits;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar35;
                                if ((int)uVar35 < 1) goto LAB_0043ec06;
                              }
                              sVar10 = z->code_buffer;
                              z->code_buffer = sVar10 * 2;
                              paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar35 - 1);
                              z->code_bits = uVar35 - 1;
                              if (((int)sVar10 < 0) &&
                                 (sVar3 = psVar29[bVar7], (uVar23 & (int)sVar3) == 0)) {
                                sVar6 = (short)((uint)iVar11 >> 0x10);
                                if (sVar3 < 1) {
                                  sVar6 = -sVar6;
                                }
                                psVar29[bVar7] = sVar3 + sVar6;
                              }
                            }
LAB_0043ec06:
                            uVar26 = uVar30 + 1;
                            uVar28 = z->spec_end;
                            uVar32 = (ulong)(int)uVar28;
                            bVar40 = (long)uVar30 < (long)uVar32;
                            uVar30 = uVar26;
                          } while (bVar40);
                        }
                      } while ((int)uVar26 <= (int)uVar28);
                    }
                    else {
                      z->eob_run = iVar11 + -1;
                      if (z->spec_start <= z->spec_end) {
                        uVar23 = (0x10000 << (bVar7 & 0x1f)) >> 0x10;
                        do {
                          bVar7 = ""[uVar26];
                          if (psVar29[bVar7] != 0) {
                            iVar14 = z->code_bits;
                            if (iVar14 < 1) {
                              stbi__grow_buffer_unsafe(z);
                              iVar14 = z->code_bits;
                              if (iVar14 < 1) goto LAB_0043e83e;
                            }
                            sVar10 = z->code_buffer;
                            z->code_buffer = sVar10 * 2;
                            z->code_bits = iVar14 + -1;
                            if (((int)sVar10 < 0) &&
                               (sVar3 = psVar29[bVar7], (uVar23 & (int)sVar3) == 0)) {
                              uVar28 = -uVar23;
                              if (0 < sVar3) {
                                uVar28 = uVar23;
                              }
                              psVar29[bVar7] = (short)uVar28 + sVar3;
                            }
                          }
LAB_0043e83e:
                          bVar40 = (long)uVar26 < (long)z->spec_end;
                          uVar26 = uVar26 + 1;
                        } while (bVar40);
                      }
                    }
                  }
                  iVar14 = z->todo;
                  z->todo = iVar14 + -1;
                  if (iVar14 < 2) {
                    if (z->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(z);
                    }
                    bVar7 = z->marker;
                    if ((bVar7 & 0xf8) != 0xd0) goto LAB_0043f545;
                    z->code_buffer = 0;
                    z->code_bits = 0;
                    z->nomore = 0;
                    z->img_comp[3].dc_pred = 0;
                    z->img_comp[2].dc_pred = 0;
                    z->img_comp[1].dc_pred = 0;
                    z->img_comp[0].dc_pred = 0;
                    z->marker = 0xff;
                    iVar14 = z->restart_interval;
                    if (iVar14 == 0) {
                      iVar14 = 0x7fffffff;
                    }
                    z->todo = iVar14;
                    z->eob_run = 0;
                  }
                  iVar22 = iVar22 + 1;
                } while (iVar22 != iVar13);
              }
              local_17c = local_17c + 1;
            } while (local_17c != iVar9);
          }
        }
        else {
          iVar9 = z->img_mcu_y;
          if (0 < iVar9) {
            iVar22 = z->img_mcu_x;
            iVar14 = 0;
            do {
              if (0 < iVar22) {
                iVar9 = 0;
                do {
                  iVar22 = z->scan_n;
                  if (0 < iVar22) {
                    lVar36 = 0;
                    do {
                      iVar13 = z->order[lVar36];
                      iVar11 = z->img_comp[iVar13].v;
                      if (0 < iVar11) {
                        iVar22 = paVar1[iVar13].h;
                        iVar27 = 0;
                        do {
                          if (0 < iVar22) {
                            iVar11 = 0;
                            do {
                              iVar22 = stbi__jpeg_decode_block_prog_dc
                                                 (z,paVar1[iVar13].coeff +
                                                    (iVar22 * iVar9 + iVar11 +
                                                    (paVar1[iVar13].v * iVar14 + iVar27) *
                                                    paVar1[iVar13].coeff_w) * 0x40,
                                                  z->huff_dc + paVar1[iVar13].hd,iVar13);
                              uVar23 = extraout_EDX_04;
                              if (iVar22 == 0) goto LAB_0043fe1b;
                              iVar11 = iVar11 + 1;
                              iVar22 = paVar1[iVar13].h;
                            } while (iVar11 < iVar22);
                            iVar11 = paVar1[iVar13].v;
                          }
                          iVar27 = iVar27 + 1;
                        } while (iVar27 < iVar11);
                        iVar22 = z->scan_n;
                      }
                      lVar36 = lVar36 + 1;
                    } while (lVar36 < iVar22);
                    iVar13 = z->todo;
                  }
                  z->todo = iVar13 + -1;
                  bVar40 = iVar13 < 2;
                  iVar13 = iVar13 + -1;
                  if (bVar40) {
                    if (z->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(z);
                    }
                    bVar7 = z->marker;
                    if ((bVar7 & 0xf8) != 0xd0) goto LAB_0043f545;
                    z->code_buffer = 0;
                    z->code_bits = 0;
                    z->nomore = 0;
                    z->img_comp[3].dc_pred = 0;
                    z->img_comp[2].dc_pred = 0;
                    z->img_comp[1].dc_pred = 0;
                    z->img_comp[0].dc_pred = 0;
                    z->marker = 0xff;
                    iVar13 = z->restart_interval;
                    if (iVar13 == 0) {
                      iVar13 = 0x7fffffff;
                    }
                    z->todo = iVar13;
                    z->eob_run = 0;
                  }
                  iVar9 = iVar9 + 1;
                  iVar22 = z->img_mcu_x;
                } while (iVar9 < iVar22);
                iVar9 = z->img_mcu_y;
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < iVar9);
          }
        }
        goto LAB_0043f53d;
      }
      goto LAB_0043fe08;
    }
    uVar28 = (uint)bVar7;
    if (uVar28 == 0xdc) {
      iVar9 = stbi__get16be(z->s);
      sVar10 = stbi__get16be(z->s);
      paVar25 = extraout_RDX_00;
      if (iVar9 == 4) {
        if (sVar10 == z->s->img_y) goto LAB_0043e188;
        pcVar34 = "bad DNL height";
      }
      else {
        pcVar34 = "bad DNL len";
      }
      goto LAB_0043fe08;
    }
    if (uVar28 == 0xd9) {
      psVar38 = z->s;
      if ((z->progressive != 0) && (0 < psVar38->img_n)) {
        lVar36 = 0;
        do {
          iVar9 = z->img_comp[lVar36].y + 7 >> 3;
          if (0 < iVar9) {
            uVar23 = paVar1[lVar36].x + 7 >> 3;
            iVar13 = 0;
            do {
              if (0 < (int)uVar23) {
                uVar26 = 0;
                do {
                  psVar29 = paVar1[lVar36].coeff +
                            (paVar1[lVar36].coeff_w * iVar13 + (int)uVar26) * 0x40;
                  iVar22 = paVar1[lVar36].tq;
                  lVar21 = 0;
                  do {
                    psVar29[lVar21] = psVar29[lVar21] * z->dequant[iVar22][lVar21];
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 0x40);
                  (*z->idct_block_kernel)
                            (paVar1[lVar36].data +
                             uVar26 * 8 + (long)(iVar13 * 8 * paVar1[lVar36].w2),paVar1[lVar36].w2,
                             psVar29);
                  uVar26 = uVar26 + 1;
                  uVar24 = extraout_RDX_06;
                } while (uVar26 != uVar23);
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 != iVar9);
            psVar38 = z->s;
          }
          uVar23 = (uint)uVar24;
          lVar36 = lVar36 + 1;
        } while (lVar36 < psVar38->img_n);
      }
    }
    else {
      iVar9 = stbi__process_marker(z,uVar28);
      if (iVar9 != 0) goto LAB_0043e188;
      psVar38 = z->s;
      uVar23 = extraout_EDX_00;
    }
    uVar28 = psVar38->img_n;
    uVar26 = (ulong)uVar28;
    if (uVar26 == 3) {
      bVar40 = true;
      if (z->rgb != 3) {
        if (z->app14_color_transform != 0) goto LAB_0043f886;
        bVar40 = z->jfif == 0;
      }
    }
    else {
      if ((int)uVar28 < 1) goto LAB_0043fe25;
LAB_0043f886:
      bVar40 = false;
    }
    local_148[2] = (stbi_uc *)0x0;
    lStack_130 = 0;
    local_148[0] = (stbi_uc *)0x0;
    local_148[1] = (stbi_uc *)0x0;
    sVar10 = psVar38->img_x;
    lVar36 = 0;
    uVar32 = uVar26;
    do {
      pvVar17 = malloc((ulong)(sVar10 + 3));
      *(void **)((long)&z->img_comp[0].linebuf + lVar36 * 2) = pvVar17;
      uVar23 = extraout_EDX_07;
      if (pvVar17 == (void *)0x0) goto LAB_0043fd4d;
      uVar30 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar36 * 2);
      iVar9 = (int)uVar30;
      *(int *)((long)local_e0 + lVar36) = iVar9;
      iVar13 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar36 * 2);
      *(int *)((long)local_e0 + lVar36 + 4) = iVar13;
      *(int *)((long)local_e0 + lVar36 + 0xc) = iVar13 >> 1;
      *(int *)((long)local_e0 + lVar36 + 8) =
           (int)((ulong)((sVar10 - 1) + iVar9) / (uVar30 & 0xffffffff));
      *(undefined4 *)((long)local_e0 + lVar36 + 0x10) = 0;
      uVar24 = *(undefined8 *)((long)&z->img_comp[0].data + lVar36 * 2);
      *(undefined8 *)((long)local_f0 + lVar36 + 8) = uVar24;
      *(undefined8 *)((long)local_f0 + lVar36) = uVar24;
      if (iVar9 == 2) {
        pcVar18 = stbi__resample_row_h_2;
        if (iVar13 != 1) {
          if (iVar13 != 2) goto LAB_0043f991;
          pcVar18 = z->resample_row_hv_2_kernel;
        }
      }
      else if (iVar9 == 1) {
        pcVar18 = stbi__resample_row_generic;
        if (iVar13 == 2) {
          pcVar18 = stbi__resample_row_v_2;
        }
        if (iVar13 == 1) {
          pcVar18 = resample_row_1;
        }
      }
      else {
LAB_0043f991:
        pcVar18 = stbi__resample_row_generic;
      }
      *(code **)((long)local_f8 + lVar36) = pcVar18;
      lVar36 = lVar36 + 0x30;
      uVar32 = uVar32 - 1;
    } while (uVar32 != 0);
    c = psVar38->img_y;
    pvVar17 = stbi__malloc_mad3(4,sVar10,c,1);
    uVar23 = extraout_EDX_08;
    if (pvVar17 != (void *)0x0) {
      if (c != 0) {
        paVar1 = z->img_comp;
        iVar9 = 0;
        uVar23 = 0;
        local_118 = z;
        do {
          sVar10 = psVar38->img_x;
          piVar39 = local_e0 + 4;
          uVar32 = 0;
          piVar33 = &paVar1->y;
          do {
            iVar13 = piVar39[-1];
            iVar22 = piVar39[-3];
            iVar14 = iVar22 >> 1;
            psVar19 = (stbi_uc *)
                      (**(code **)(piVar39 + -10))
                                (*(stbi_uc **)(piVar33 + 10),
                                 *(undefined8 *)
                                  ((long)piVar39 +
                                  ((ulong)(iVar14 <= iVar13) << 3 | 0xffffffffffffffe0)),
                                 *(undefined8 *)
                                  ((long)piVar39 +
                                  ((ulong)(iVar13 < iVar14) << 3 | 0xffffffffffffffe0)),piVar39[-2],
                                 piVar39[-4]);
            local_148[uVar32] = psVar19;
            z = local_118;
            piVar39[-1] = iVar13 + 1;
            if (iVar22 <= iVar13 + 1) {
              piVar39[-1] = 0;
              *(long *)(piVar39 + -8) = *(long *)(piVar39 + -6);
              iVar13 = *piVar39;
              *piVar39 = iVar13 + 1;
              if (iVar13 + 1 < *piVar33) {
                *(long *)(piVar39 + -6) = *(long *)(piVar39 + -6) + (long)piVar33[1];
              }
            }
            uVar32 = uVar32 + 1;
            piVar33 = piVar33 + 0x18;
            piVar39 = piVar39 + 0xc;
          } while (uVar26 != uVar32);
          psVar19 = (stbi_uc *)((ulong)(uVar23 * sVar10 * 4) + (long)pvVar17);
          psVar38 = local_118->s;
          if (psVar38->img_n == 3) {
            if (bVar40) {
              if (psVar38->img_x != 0) {
                uVar28 = sVar10 * iVar9;
                uVar32 = 0;
                do {
                  *(stbi_uc *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28) = local_148[0][uVar32];
                  *(stbi_uc *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 1) =
                       local_148[1][uVar32];
                  *(stbi_uc *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 2) =
                       local_148[2][uVar32];
                  *(undefined1 *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 3) = 0xff;
                  uVar32 = uVar32 + 1;
                } while (uVar32 < psVar38->img_x);
              }
            }
            else {
LAB_0043fc53:
              (*local_118->YCbCr_to_RGB_kernel)
                        (psVar19,local_148[0],local_148[1],local_148[2],psVar38->img_x,4);
              psVar38 = z->s;
            }
          }
          else if (psVar38->img_n == 4) {
            if (local_118->app14_color_transform == 2) {
              (*local_118->YCbCr_to_RGB_kernel)
                        (psVar19,local_148[0],local_148[1],local_148[2],psVar38->img_x,4);
              psVar38 = z->s;
              if (psVar38->img_x != 0) {
                uVar28 = sVar10 * iVar9;
                uVar32 = 0;
                do {
                  bVar7 = *(byte *)(lStack_130 + uVar32);
                  iVar13 = (*(byte *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28) ^ 0xff) *
                           (uint)bVar7;
                  *(char *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  iVar13 = (*(byte *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 1) ^ 0xff) *
                           (uint)bVar7;
                  *(char *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 1) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  iVar13 = (*(byte *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 2) ^ 0xff) *
                           (uint)bVar7;
                  *(char *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 2) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  uVar32 = uVar32 + 1;
                } while (uVar32 < psVar38->img_x);
              }
            }
            else {
              if (local_118->app14_color_transform != 0) goto LAB_0043fc53;
              if (psVar38->img_x != 0) {
                uVar28 = sVar10 * iVar9;
                uVar32 = 0;
                do {
                  bVar7 = *(byte *)(lStack_130 + uVar32);
                  iVar13 = (uint)local_148[0][uVar32] * (uint)bVar7;
                  *(char *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  iVar13 = (uint)local_148[1][uVar32] * (uint)bVar7;
                  *(char *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 1) =
                       (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                  *(char *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 2) =
                       (char)(((uint)local_148[2][uVar32] * (uint)bVar7 + 0x80 >> 8) +
                              (uint)local_148[2][uVar32] * (uint)bVar7 + 0x80 >> 8);
                  *(undefined1 *)((long)pvVar17 + uVar32 * 4 + (ulong)uVar28 + 3) = 0xff;
                  uVar32 = uVar32 + 1;
                } while (uVar32 < psVar38->img_x);
              }
            }
          }
          else if (psVar38->img_x != 0) {
            uVar30 = (ulong)(sVar10 * iVar9);
            uVar32 = 0;
            do {
              sVar8 = local_148[0][uVar32];
              *(stbi_uc *)((long)pvVar17 + uVar32 * 4 + uVar30 + 2) = sVar8;
              *(stbi_uc *)((long)pvVar17 + uVar32 * 4 + uVar30 + 1) = sVar8;
              *(stbi_uc *)((long)pvVar17 + uVar32 * 4 + uVar30) = sVar8;
              *(undefined1 *)((long)pvVar17 + uVar32 * 4 + uVar30 + 3) = 0xff;
              uVar32 = uVar32 + 1;
            } while (uVar32 < psVar38->img_x);
          }
          uVar23 = uVar23 + 1;
          iVar9 = iVar9 + 4;
        } while (uVar23 < psVar38->img_y);
      }
      stbi__free_jpeg_components(z,psVar38->img_n,uVar23);
      psVar38 = z->s;
      *local_110 = psVar38->img_x;
      *local_108 = psVar38->img_y;
      if (local_100 != (int *)0x0) {
        *local_100 = (uint)(2 < psVar38->img_n) * 2 + 1;
      }
      goto LAB_0043fe2d;
    }
LAB_0043fd4d:
    stbi__free_jpeg_components(z,psVar38->img_n,uVar23);
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
  }
  pvVar17 = (void *)0x0;
LAB_0043fe2d:
  free(z);
  return pvVar17;
LAB_0043f531:
  bVar40 = false;
LAB_0043f534:
  if (!bVar40) goto LAB_0043fe1b;
LAB_0043f53d:
  bVar7 = z->marker;
LAB_0043f545:
  if (bVar7 == 0xff) {
    while (psVar38 = z->s, (psVar38->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0043f6d6:
      if (psVar38->img_buffer_end <= psVar38->img_buffer) goto LAB_0043f6ea;
LAB_0043f563:
      psVar38 = z->s;
      psVar19 = psVar38->img_buffer;
      if (psVar19 < psVar38->img_buffer_end) {
        psVar38->img_buffer = psVar19 + 1;
        sVar8 = *psVar19;
      }
      else if (psVar38->read_from_callbacks == 0) {
        sVar8 = '\0';
      }
      else {
        psVar19 = psVar38->buffer_start;
        iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
        psVar38->callback_already_read =
             psVar38->callback_already_read +
             (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
        if (iVar9 == 0) {
          psVar38->read_from_callbacks = 0;
          psVar20 = psVar38->buffer_start + 1;
          psVar38->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar20 = psVar19 + iVar9;
          sVar8 = *psVar19;
        }
        psVar38->img_buffer_end = psVar20;
        psVar38->img_buffer = psVar38->buffer_start + 1;
      }
      while (sVar8 == 0xff) {
        psVar38 = z->s;
        if ((psVar38->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0043f60d:
          if (psVar38->img_buffer_end <= psVar38->img_buffer) goto LAB_0043f6ea;
        }
        else {
          iVar9 = (*(psVar38->io).eof)(psVar38->io_user_data);
          if (iVar9 != 0) {
            if (psVar38->read_from_callbacks != 0) goto LAB_0043f60d;
            goto LAB_0043f6ea;
          }
        }
        psVar38 = z->s;
        psVar19 = psVar38->img_buffer;
        if (psVar19 < psVar38->img_buffer_end) {
          psVar38->img_buffer = psVar19 + 1;
          sVar8 = *psVar19;
        }
        else if (psVar38->read_from_callbacks == 0) {
          sVar8 = '\0';
        }
        else {
          psVar19 = psVar38->buffer_start;
          iVar9 = (*(psVar38->io).read)(psVar38->io_user_data,(char *)psVar19,psVar38->buflen);
          psVar38->callback_already_read =
               psVar38->callback_already_read +
               (*(int *)&psVar38->img_buffer - *(int *)&psVar38->img_buffer_original);
          if (iVar9 == 0) {
            psVar38->read_from_callbacks = 0;
            psVar20 = psVar38->buffer_start + 1;
            psVar38->buffer_start[0] = '\0';
            sVar8 = '\0';
          }
          else {
            psVar20 = psVar19 + iVar9;
            sVar8 = *psVar19;
          }
          psVar38->img_buffer_end = psVar20;
          psVar38->img_buffer = psVar38->buffer_start + 1;
        }
        if ((byte)(sVar8 - 1) < 0xfe) goto LAB_0043f6f1;
      }
    }
    iVar9 = (*(psVar38->io).eof)(psVar38->io_user_data);
    if (iVar9 == 0) goto LAB_0043f563;
    if (psVar38->read_from_callbacks != 0) goto LAB_0043f6d6;
LAB_0043f6ea:
    sVar8 = 0xff;
LAB_0043f6f1:
    z->marker = sVar8;
  }
  bVar7 = stbi__get_marker(z);
  uVar24 = extraout_RDX_05;
  if ((bVar7 & 0xf8) == 0xd0) {
LAB_0043e188:
    bVar7 = stbi__get_marker(z);
    uVar24 = extraout_RDX_01;
  }
  goto LAB_0043e132;
LAB_0043fdf6:
  paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar28 - 0x10);
  z->code_bits = uVar28 - 0x10;
LAB_0043fe01:
  pcVar34 = "bad huffman code";
LAB_0043fe08:
  uVar23 = (uint)paVar25;
  *(char **)(*in_FS_OFFSET + -8) = pcVar34;
  goto LAB_0043fe1b;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}